

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O0

path * fsbridge::AbsPathJoin(path *base,path *path)

{
  bool bVar1;
  path *in_RDI;
  long in_FS_OFFSET;
  path *in_stack_ffffffffffffff78;
  path *p2;
  path *p1;
  path local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p1 = in_RDI;
  bVar1 = std::filesystem::__cxx11::path::is_absolute(in_stack_ffffffffffffff78);
  if (!bVar1) {
    __assert_fail("base.is_absolute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/fs.cpp"
                  ,0x26,"fs::path fsbridge::AbsPathJoin(const fs::path &, const fs::path &)");
  }
  bVar1 = std::filesystem::__cxx11::path::empty(in_stack_ffffffffffffff78);
  if (bVar1) {
    fs::path::path((path *)in_stack_ffffffffffffff78,(path *)0x358a4d);
  }
  else {
    p2 = &local_30;
    fs::path::path((path *)in_stack_ffffffffffffff78,(path *)0x358a63);
    fs::operator/(p1,p2);
    fs::path::~path((path *)in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

fs::path AbsPathJoin(const fs::path& base, const fs::path& path)
{
    assert(base.is_absolute());
    return path.empty() ? base : fs::path(base / path);
}